

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O1

void __thiscall FIX::Session::next(Session *this,UtcTimeStamp *now)

{
  function<FIX::UtcTimeStamp_()> *pfVar1;
  SessionState *pSVar2;
  int *piVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  _Any_data *p_Var8;
  bool bVar9;
  int iVar10;
  int iVar11;
  long *plVar12;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R12;
  undefined1 auVar13 [12];
  string local_80;
  allocator<char> local_59;
  SessionState *local_58;
  _Any_data *local_50;
  UtcTimeStamp local_48;
  
  bVar9 = checkSessionTime(this,now);
  if (!bVar9) {
    reset(this);
    return;
  }
  if (((this->m_state).m_enabled != true) ||
     (bVar9 = TimeRange::isInRange(&this->m_logonTime,now), !bVar9)) {
    if ((this->m_state).m_receivedLogon != true) {
      return;
    }
    if (((this->m_state).m_sentLogon & 1U) == 0) {
      return;
    }
    if ((this->m_state).m_sentLogout == false) {
      unaff_R12 = &local_80.field_2;
      local_80._M_dataplus._M_p = (pointer)unaff_R12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Initiated logout request","");
      SessionState::onEvent(&this->m_state,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      SessionState::logoutReason_abi_cxx11_(&local_80,&this->m_state);
      generateLogout(this,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != unaff_R12) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  pSVar2 = &this->m_state;
  if ((this->m_state).m_receivedLogon == false) {
    if ((((this->m_state).m_initiate == true) && (((this->m_state).m_sentLogon & 1U) == 0)) &&
       (bVar9 = TimeRange::isInRange(&this->m_logonTime,now), bVar9)) {
      generateLogon(this);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Initiated logon request","");
      SessionState::onEvent(pSVar2,&local_80);
LAB_001a622a:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p == &local_80.field_2) {
        return;
      }
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      return;
    }
    if (((this->m_state).m_sentLogon & (this->m_state).m_initiate) != 1) {
      bVar9 = false;
LAB_001a62cf:
      if (!bVar9) {
        return;
      }
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Timed out waiting for logon response","");
      SessionState::onEvent(pSVar2,&local_80);
LAB_001a633c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      disconnect(this);
      return;
    }
    if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_timestamper)._M_invoker)(&local_48,(_Any_data *)&this->m_timestamper);
      auVar6 = SEXT816(-0x112e0be826d694b3) *
               SEXT816((this->m_state).m_lastReceivedTime.super_DateTime.m_time);
      bVar9 = (this->m_state).m_logonTimeout <=
              ((int)(auVar6._8_8_ >> 0x1a) - (auVar6._12_4_ >> 0x1f)) +
              ((int)(SUB168(SEXT816(0x112e0be826d694b3) * SEXT816(local_48.super_DateTime.m_time),8)
                    >> 0x1a) -
              (SUB164(SEXT816(0x112e0be826d694b3) * SEXT816(local_48.super_DateTime.m_time),0xc) >>
              0x1f)) + (local_48.super_DateTime.m_date -
                       (this->m_state).m_lastReceivedTime.super_DateTime.m_date) * 0x15180;
      goto LAB_001a62cf;
    }
LAB_001a639e:
    std::__throw_bad_function_call();
LAB_001a63a3:
    std::__throw_bad_function_call();
  }
  else {
    unaff_R12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(this->m_state).m_heartBtInt;
    iVar10 = IntField::getValue((IntField *)unaff_R12);
    if (iVar10 == 0) {
      return;
    }
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
LAB_001a6399:
      std::__throw_bad_function_call();
      goto LAB_001a639e;
    }
    pfVar1 = &this->m_timestamper;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_80,(_Any_data *)pfVar1);
    if (((this->m_state).m_sentLogout == true) &&
       (auVar6 = SEXT816(-0x112e0be826d694b3) *
                 SEXT816((this->m_state).m_lastSentTime.super_DateTime.m_time),
       (this->m_state).m_logoutTimeout <=
       ((int)(auVar6._8_8_ >> 0x1a) - (auVar6._12_4_ >> 0x1f)) +
       ((int)(SUB168(SEXT816(0x112e0be826d694b3) *
                     SEXT816((long)local_80.field_2._M_allocated_capacity),8) >> 0x1a) -
       (SUB164(SEXT816(0x112e0be826d694b3) * SEXT816((long)local_80.field_2._M_allocated_capacity),
               0xc) >> 0x1f)) +
       ((int)local_80._M_string_length - (this->m_state).m_lastSentTime.super_DateTime.m_date) *
       0x15180)) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Timed out waiting for logout response","");
      SessionState::onEvent(pSVar2,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      disconnect(this);
    }
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001a6399;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_80,(_Any_data *)pfVar1);
    bVar9 = SessionState::withinHeartBeat(pSVar2,(UtcTimeStamp *)&local_80);
    if (bVar9) {
      return;
    }
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0)
    goto LAB_001a63a3;
    local_58 = pSVar2;
    local_50 = (_Any_data *)pfVar1;
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_80,(_Any_data *)pfVar1);
    uVar7 = local_80.field_2._M_allocated_capacity;
    iVar10 = (this->m_state).m_lastReceivedTime.super_DateTime.m_date;
    lVar5 = (this->m_state).m_lastReceivedTime.super_DateTime.m_time;
    iVar11 = IntField::getValue((IntField *)unaff_R12);
    p_Var8 = local_50;
    pSVar2 = local_58;
    auVar6 = SEXT816(lVar5) * SEXT816(-0x112e0be826d694b3);
    if ((double)iVar11 * 2.4 <=
        (double)(((int)(auVar6._8_8_ >> 0x1a) - (auVar6._12_4_ >> 0x1f)) +
                 ((int)(SUB168(SEXT816((long)uVar7) * SEXT816(0x112e0be826d694b3),8) >> 0x1a) -
                 (SUB164(SEXT816((long)uVar7) * SEXT816(0x112e0be826d694b3),0xc) >> 0x1f)) +
                ((int)local_80._M_string_length - iVar10) * 0x15180)) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"Timed out waiting for heartbeat","");
      SessionState::onEvent(local_58,&local_80);
      goto LAB_001a633c;
    }
    if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_80,local_50);
      bVar9 = SessionState::needTestRequest(pSVar2,(UtcTimeStamp *)&local_80);
      if (bVar9) {
        paVar4 = &local_80.field_2;
        local_80._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"TEST","");
        generateTestRequest(this,&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != paVar4) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        piVar3 = &(this->m_state).m_testRequest;
        *piVar3 = *piVar3 + 1;
        local_80._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,"Sent test request TEST","");
        SessionState::onEvent(pSVar2,&local_80);
        goto LAB_001a622a;
      }
      if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)&local_80,p_Var8);
        bVar9 = SessionState::needHeartbeat(pSVar2,(UtcTimeStamp *)&local_80);
        if (!bVar9) {
          return;
        }
        generateHeartbeat(this);
        return;
      }
      goto LAB_001a63ad;
    }
  }
  std::__throw_bad_function_call();
LAB_001a63ad:
  auVar13 = std::__throw_bad_function_call();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != unaff_R12) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (auVar13._8_4_ == 1) {
    plVar12 = (long *)__cxa_begin_catch(auVar13._0_8_);
    __s = (char *)(**(code **)(*plVar12 + 0x10))(plVar12);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,__s,&local_59);
    SessionState::onEvent(&this->m_state,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    disconnect(this);
    __cxa_end_catch();
    return;
  }
  _Unwind_Resume(auVar13._0_8_);
}

Assistant:

void Session::next(const UtcTimeStamp &now) {
  try {
    if (!checkSessionTime(now)) {
      reset();
      return;
    }

    if (!isEnabled() || !isLogonTime(now)) {
      if (isLoggedOn()) {
        if (!m_state.sentLogout()) {
          m_state.onEvent("Initiated logout request");
          generateLogout(m_state.logoutReason());
        }
      } else {
        return;
      }
    }

    if (!m_state.receivedLogon()) {
      if (m_state.shouldSendLogon() && isLogonTime(now)) {
        generateLogon();
        m_state.onEvent("Initiated logon request");
      } else if (m_state.alreadySentLogon() && m_state.logonTimedOut(m_timestamper())) {
        m_state.onEvent("Timed out waiting for logon response");
        disconnect();
      }
      return;
    }

    if (m_state.heartBtInt() == 0) {
      return;
    }

    if (m_state.logoutTimedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for logout response");
      disconnect();
    }

    if (m_state.withinHeartBeat(m_timestamper())) {
      return;
    }

    if (m_state.timedOut(m_timestamper())) {
      m_state.onEvent("Timed out waiting for heartbeat");
      disconnect();
    } else {
      if (m_state.needTestRequest(m_timestamper())) {
        generateTestRequest("TEST");
        m_state.testRequest(m_state.testRequest() + 1);
        m_state.onEvent("Sent test request TEST");
      } else if (m_state.needHeartbeat(m_timestamper())) {
        generateHeartbeat();
      }
    }
  } catch (FIX::IOException &e) {
    m_state.onEvent(e.what());
    disconnect();
  }
}